

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

ostream * __thiscall
tchecker::parsing::clock_declaration_t::output(clock_declaration_t *this,ostream *os)

{
  ostream *poVar1;
  ostream *os_local;
  clock_declaration_t *this_local;
  
  poVar1 = std::operator<<(os,"clock:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_size);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::operator<<(poVar1,(string *)&this->_name);
  poVar1 = parsing::operator<<(poVar1,&(this->super_inner_declaration_t).super_declaration_t._attr);
  return poVar1;
}

Assistant:

std::ostream & clock_declaration_t::output(std::ostream & os) const { return os << "clock:" << _size << ":" << _name << _attr; }